

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# definition.cpp
# Opt level: O3

string * __thiscall
huelang::DefinitionTable::GetName_abi_cxx11_
          (string *__return_storage_ptr__,DefinitionTable *this,Word word)

{
  pointer pDVar1;
  long lVar2;
  
  pDVar1 = this->buckets[word._0_8_ & 0xffff].
           super__Vector_base<huelang::DefinitionTableEntry,_std::allocator<huelang::DefinitionTableEntry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  lVar2 = *(long *)&pDVar1[word.minor].name._M_dataplus;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,lVar2,pDVar1[word.minor].name._M_string_length + lVar2
            );
  return __return_storage_ptr__;
}

Assistant:

string DefinitionTable::GetName(Word word) {
        return buckets[word.major][word.minor].name;
    }